

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_core_generic_syslog.c
# Opt level: O0

void os_core_generic_syslog(oonf_log_severity severity,char *msg)

{
  int local_1c;
  int log_sev;
  char *msg_local;
  oonf_log_severity severity_local;
  
  if (severity == LOG_SEVERITY_DEBUG) {
    local_1c = 7;
  }
  else if (severity == LOG_SEVERITY_INFO) {
    local_1c = 5;
  }
  else {
    local_1c = 4;
  }
  syslog(local_1c,"%s",msg);
  return;
}

Assistant:

void
os_core_generic_syslog(enum oonf_log_severity severity, const char *msg) {
  int log_sev;

  switch (severity) {
    case LOG_SEVERITY_DEBUG:
      log_sev = LOG_DEBUG;
      break;
    case LOG_SEVERITY_INFO:
      log_sev = LOG_NOTICE;
      break;
    default:
    case LOG_SEVERITY_WARN:
      log_sev = LOG_WARNING;
      break;
  }

  syslog(log_sev, "%s", msg);
}